

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.c
# Opt level: O0

void get_freq(ubyte iobyte)

{
  ubyte iobyte_local;
  
  if ((iobyte & 0x80) != 0) {
    if ((iobyte & 0x60) == 0) {
      get_freq::channel = '\x03';
    }
    else if ((iobyte & 0x60) == 0x20) {
      get_freq::channel = '\x02';
    }
    else if ((iobyte & 0x60) == 0x40) {
      get_freq::channel = '\x01';
    }
    freqbits[get_freq::channel] = 0;
    freqbits[get_freq::channel] = freqbits[get_freq::channel] | iobyte & 0xf;
  }
  if ((iobyte & 0x80) == 0) {
    freqbits[get_freq::channel] = freqbits[get_freq::channel] & 0xf;
    freqbits[get_freq::channel] = freqbits[get_freq::channel] | (iobyte & 0x3f) << 4;
  }
  return;
}

Assistant:

void get_freq(ubyte iobyte) {      // used to extract frequency data from
    // a byte
    static ubyte channel = 0xFF;

    if (iobyte & 0x80) {              // select channel

        switch (iobyte & 0x60) {
            case 0x00:
                channel = 3;
                break;
            case 0x20:
                channel = 2;
                break;
            case 0x40:
                channel = 1;
                break;
        }

        freqbits[channel] &= 0;             // update high order bits of channel
        freqbits[channel] |= (iobyte & 0xF);
    }

    if (!(iobyte & 0x80)) {          // if a `low order' frequency byte

        freqbits[channel] &= 0x000F;
        freqbits[channel] |= (((uint) (iobyte & 0x3F)) << 4); // update low order bits
    }
}